

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O3

bool __thiscall spvtools::Optimizer::FlagHasValidForm(Optimizer *this,string *flag)

{
  int iVar1;
  bool bVar2;
  spv_position_t local_58;
  pointer local_30;
  
  iVar1 = std::__cxx11::string::compare((char *)flag);
  bVar2 = true;
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)flag), iVar1 != 0)) {
    if (2 < flag->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)flag);
      iVar1 = std::__cxx11::string::compare((char *)&local_58);
      if ((size_t *)local_58.line != &local_58.index) {
        operator_delete((void *)local_58.line,local_58.index + 1);
      }
      if (iVar1 == 0) {
        return true;
      }
    }
    local_58.line = 0;
    local_58.column = 0;
    local_58.index = 0;
    local_30 = (flag->_M_dataplus)._M_p;
    bVar2 = false;
    Logf<char_const*>(&(((this->impl_)._M_t.
                         super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
                         .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->
                       pass_manager).consumer_,SPV_MSG_ERROR,(char *)0x0,&local_58,
                      "%s is not a valid flag.  Flag passes should have the form \'--pass_name[=pass_args]\'. Special flag names also accepted: -O and -Os."
                      ,&local_30);
  }
  return bVar2;
}

Assistant:

bool Optimizer::FlagHasValidForm(const std::string& flag) const {
  if (flag == "-O" || flag == "-Os") {
    return true;
  } else if (flag.size() > 2 && flag.substr(0, 2) == "--") {
    return true;
  }

  Errorf(consumer(), nullptr, {},
         "%s is not a valid flag.  Flag passes should have the form "
         "'--pass_name[=pass_args]'. Special flag names also accepted: -O "
         "and -Os.",
         flag.c_str());
  return false;
}